

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O2

cbtBvhTriangleMeshShape * __thiscall
cbtCollisionWorldImporter::createBvhTriangleMeshShape
          (cbtCollisionWorldImporter *this,cbtStridingMeshInterface *trimesh,cbtOptimizedBvh *bvh)

{
  cbtBvhTriangleMeshShape *this_00;
  cbtVector3 local_38;
  
  this_00 = (cbtBvhTriangleMeshShape *)cbtBvhTriangleMeshShape::operator_new(0x68);
  if (bvh == (cbtOptimizedBvh *)0x0) {
    cbtBvhTriangleMeshShape::cbtBvhTriangleMeshShape(this_00,trimesh,true,true);
  }
  else {
    cbtBvhTriangleMeshShape::cbtBvhTriangleMeshShape
              (this_00,trimesh,(bvh->super_cbtQuantizedBvh).m_useQuantization,false);
    local_38.m_floats[0] = 1.0;
    local_38.m_floats[1] = 1.0;
    local_38.m_floats[2] = 1.0;
    local_38.m_floats[3] = 0.0;
    cbtBvhTriangleMeshShape::setOptimizedBvh(this_00,bvh,&local_38);
  }
  local_38.m_floats._0_8_ = this_00;
  cbtAlignedObjectArray<cbtCollisionShape_*>::push_back
            (&this->m_allocatedCollisionShapes,(cbtCollisionShape **)&local_38);
  return this_00;
}

Assistant:

cbtBvhTriangleMeshShape* cbtCollisionWorldImporter::createBvhTriangleMeshShape(cbtStridingMeshInterface* trimesh, cbtOptimizedBvh* bvh)
{
	if (bvh)
	{
		cbtBvhTriangleMeshShape* bvhTriMesh = new cbtBvhTriangleMeshShape(trimesh, bvh->isQuantized(), false);
		bvhTriMesh->setOptimizedBvh(bvh);
		m_allocatedCollisionShapes.push_back(bvhTriMesh);
		return bvhTriMesh;
	}

	cbtBvhTriangleMeshShape* ts = new cbtBvhTriangleMeshShape(trimesh, true);
	m_allocatedCollisionShapes.push_back(ts);
	return ts;
}